

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

int bn_cmp_words(unsigned_long *a,unsigned_long *b,int n)

{
  unsigned_long bb;
  unsigned_long aa;
  int i;
  int n_local;
  unsigned_long *b_local;
  unsigned_long *a_local;
  int local_4;
  
  if (a[n + -1] == b[n + -1]) {
    for (i = n + -2; -1 < i; i = i + -1) {
      if (a[i] != b[i]) {
        if (a[i] <= b[i]) {
          return -1;
        }
        return 1;
      }
    }
    local_4 = 0;
  }
  else {
    local_4 = -1;
    if (b[n + -1] < a[n + -1]) {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int bn_cmp_words(const BN_ULONG *a, const BN_ULONG *b, int n)
{
    int i;
    BN_ULONG aa, bb;

    aa = a[n - 1];
    bb = b[n - 1];
    if (aa != bb)
        return ((aa > bb) ? 1 : -1);
    for (i = n - 2; i >= 0; i--) {
        aa = a[i];
        bb = b[i];
        if (aa != bb)
            return ((aa > bb) ? 1 : -1);
    }
    return (0);
}